

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<IsStringTest,_testing::internal::TemplateSel<IsStringTest_IsString_Test>,_testing::internal::Types4<char,_wchar_t,_char16_t,_char32_t>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  char *test_case_name;
  char *type_param;
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  char *pcVar4;
  TestFactoryBase *factory;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  allocator local_13d;
  int index_local;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  char *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  char *local_f8;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  char *local_b0 [2];
  char local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  char *local_70 [2];
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  index_local = index;
  std::__cxx11::string::string((string *)local_50,prefix,&local_13d);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0 = &local_c0;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar2[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_128 = *puVar6;
    lStack_120 = plVar2[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *puVar6;
    local_138 = (ulong *)*plVar2;
  }
  local_130 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  StreamableToString<int>(&local_f0,&index_local);
  uVar7 = 0xf;
  if (local_138 != &local_128) {
    uVar7 = local_128;
  }
  if (uVar7 < local_f0._M_string_length + local_130) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar8 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_130 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_138);
      goto LAB_0012143d;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f0._M_dataplus._M_p);
LAB_0012143d:
  local_118 = (char *)&local_108;
  pcVar4 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar4) {
    local_108 = *(undefined8 *)pcVar4;
    uStack_100 = puVar3[3];
  }
  else {
    local_108 = *(undefined8 *)pcVar4;
    local_118 = (char *)*puVar3;
  }
  test_case_name = local_118;
  local_110 = puVar3[1];
  *puVar3 = pcVar4;
  puVar3[1] = 0;
  *pcVar4 = '\0';
  pcVar4 = strchr(test_names,0x2c);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string((string *)local_b0,test_names,(allocator *)local_70);
  }
  else {
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,test_names,pcVar4);
  }
  pcVar4 = local_b0[0];
  local_f8 = prefix;
  GetTypeName<char>();
  type_param = local_70[0];
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001d8cc0;
  MakeAndRegisterTestInfo
            (test_case_name,pcVar4,type_param,(char *)0x0,&TypeIdHelper<IsStringTest<char>>::dummy_,
             Test::SetUpTestCase,Test::TearDownTestCase,factory);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  pcVar4 = local_f8;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_118 != (char *)&local_108) {
    operator_delete(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  bVar1 = TypeParameterizedTest<IsStringTest,_testing::internal::TemplateSel<IsStringTest_IsString_Test>,_testing::internal::Types3<wchar_t,_char16_t,_char32_t>_>
          ::Register(pcVar4,case_name,test_names,index_local + 1);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name + "/"
         + StreamableToString(index)).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }